

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O1

bool P_Teleport(AActor *thing,DVector3 *pos,DAngle *angle,int flags)

{
  Angle *pAVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  sector_t_conflict *psVar5;
  player_t *ppVar6;
  AInventory *pAVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  subsector_t *psVar11;
  Angle *pAVar12;
  player_t *ppVar13;
  byte bVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  DVector3 old;
  DVector2 fogpos;
  DVector2 vector;
  double local_98;
  DVector3 local_80;
  double local_68;
  double dStack_60;
  TAngle<double> local_58;
  double local_50;
  DVector3 local_48;
  
  if (thing->player == (player_t *)0x0) {
    bVar14 = 0;
  }
  else {
    bVar14 = (*(byte *)((long)&thing->player->cheats + 1) & 0x20) >> 5;
  }
  local_80.X = (thing->__Pos).X;
  local_80.Y = (thing->__Pos).Y;
  local_80.Z = (thing->__Pos).Z;
  dVar8 = local_80.Z - thing->floorz;
  psVar11 = P_PointInSubsector(pos->X,pos->Y);
  psVar5 = psVar11->sector;
  ppVar6 = thing->player;
  ppVar13 = (player_t *)0x0;
  if ((ppVar6 != (player_t *)0x0) && (ppVar6->mo == (APlayerPawn *)thing)) {
    ppVar13 = ppVar6;
  }
  dVar18 = ((psVar5->floorplane).normal.Y * pos->Y +
           (psVar5->floorplane).normal.X * pos->X + (psVar5->floorplane).D) *
           (psVar5->floorplane).negiC;
  dVar17 = (pos->Y * (psVar5->ceilingplane).normal.Y +
           pos->X * (psVar5->ceilingplane).normal.X + (psVar5->ceilingplane).D) *
           (psVar5->ceilingplane).negiC;
  local_98 = 0.0;
  if (((thing->flags).Value & 0x10000) != 0) {
    dVar2 = (thing->Vel).X;
    dVar3 = (thing->Vel).Y;
    local_98 = c_sqrt(dVar3 * dVar3 + dVar2 * dVar2);
  }
  if ((flags & 0x10U) == 0) {
    if ((pos->Z == -2147483648.0) && (!NAN(pos->Z))) {
      uVar4 = (thing->flags).Value;
      if (ppVar13 == (player_t *)0x0) {
        if ((uVar4 >> 0x10 & 1) == 0) goto LAB_00459247;
      }
      else if (((uVar4 >> 9 & 1) == 0) || ((dVar8 == 0.0 && (!NAN(dVar8))))) {
LAB_00459247:
        pos->Z = dVar18;
        goto LAB_0045924d;
      }
      pos->Z = dVar8 + dVar18;
      if (dVar17 < dVar8 + dVar18 + thing->Height) {
        pos->Z = dVar17 - thing->Height;
      }
    }
  }
  else {
    pos->Z = dVar8 + dVar18;
  }
LAB_0045924d:
  bVar9 = P_TeleportMove(thing,pos,false,true);
  if (!bVar9) {
    return bVar9;
  }
  if (ppVar13 != (player_t *)0x0) {
    ppVar13->viewz = (thing->__Pos).Z + ppVar13->viewheight;
  }
  pAVar1 = &(thing->Angles).Yaw;
  pAVar12 = pAVar1;
  if ((flags & 4U) != 0) {
    pAVar12 = angle;
    angle = pAVar1;
  }
  pAVar12->Degrees = angle->Degrees;
  if ((flags & 2U) != 0 && bVar14 == 0) {
    P_SpawnTeleportFog(thing,&local_80,true,true);
  }
  if ((flags & 1U) != 0) {
    if (bVar14 == 0) {
      TAngle<double>::ToVector(&local_58,20.0);
      P_GetOffsetPosition(pos->X,pos->Y,local_58.Degrees,local_50);
      local_48.Z = (thing->__Pos).Z;
      local_48.X = local_68;
      local_48.Y = dStack_60;
      P_SpawnTeleportFog(thing,&local_48,false,true);
    }
    ppVar6 = thing->player;
    if ((((ppVar6 != (player_t *)0x0) && (telezoom.Value == true)) && ((flags & 8U) == 0)) &&
       (ppVar6->mo == (APlayerPawn *)thing)) {
      fVar15 = ppVar6->DesiredFOV + 45.0;
      fVar16 = 175.0;
      if (fVar15 <= 175.0) {
        fVar16 = fVar15;
      }
      ppVar6->FOV = fVar16;
    }
  }
  if ((thing->player != (player_t *)0x0) && ((char)((flags & 8U) >> 3) == '\0' && (flags & 5U) != 4)
     ) {
    pAVar7 = (thing->Inventory).field_0.p;
    if (pAVar7 != (AInventory *)0x0) {
      if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        bVar10 = AInventory::GetNoTeleportFreeze((thing->Inventory).field_0.p);
        if (bVar10) goto LAB_004593d3;
      }
      else {
        (thing->Inventory).field_0.p = (AInventory *)0x0;
      }
    }
    thing->reactiontime = 0x12;
  }
LAB_004593d3:
  if (((thing->flags).Value & 0x10000) == 0) {
    if ((flags & 0xcU) == 0) {
      (thing->Vel).X = 0.0;
      (thing->Vel).Y = 0.0;
      (thing->Vel).Z = 0.0;
      if (ppVar13 != (player_t *)0x0) {
        (ppVar13->Vel).X = 0.0;
        (ppVar13->Vel).Y = 0.0;
      }
    }
  }
  else {
    AActor::VelFromAngle(thing,local_98);
  }
  return bVar9;
}

Assistant:

bool P_Teleport (AActor *thing, DVector3 pos, DAngle angle, int flags)
{
	bool predicting = (thing->player && (thing->player->cheats & CF_PREDICTING));

	DVector3 old;
	double aboveFloor;
	player_t *player;
	sector_t *destsect;
	bool resetpitch = false;
	double floorheight, ceilingheight;
	double missilespeed = 0;

	old = thing->Pos();
	aboveFloor = thing->Z() - thing->floorz;
	destsect = P_PointInSector (pos);
	// killough 5/12/98: exclude voodoo dolls:
	player = thing->player;
	if (player && player->mo != thing)
		player = NULL;
	floorheight = destsect->floorplane.ZatPoint (pos);
	ceilingheight = destsect->ceilingplane.ZatPoint (pos);
	if (thing->flags & MF_MISSILE)
	{ // We don't measure z velocity, because it doesn't change.
		missilespeed = thing->VelXYToSpeed();
	}
	if (flags & TELF_KEEPHEIGHT)
	{
		pos.Z = floorheight + aboveFloor;
	}
	else if (pos.Z == ONFLOORZ)
	{
		if (player)
		{
			if (thing->flags & MF_NOGRAVITY && aboveFloor)
			{
				pos.Z = floorheight + aboveFloor;
				if (pos.Z + thing->Height > ceilingheight)
				{
					pos.Z = ceilingheight - thing->Height;
				}
			}
			else
			{
				pos.Z = floorheight;
				if (!(flags & TELF_KEEPORIENTATION))
				{
					resetpitch = false;
				}
			}
		}
		else if (thing->flags & MF_MISSILE)
		{
			pos.Z = floorheight + aboveFloor;
			if (pos.Z + thing->Height > ceilingheight)
			{
				pos.Z = ceilingheight - thing->Height;
			}
		}
		else
		{
			pos.Z = floorheight;
		}
	}
	if (!P_TeleportMove (thing, pos, false))
	{
		return false;
	}
	if (player)
	{
		player->viewz = thing->Z() + player->viewheight;
		if (resetpitch)
		{
			player->mo->Angles.Pitch = 0.;
		}
	}
	if (!(flags & TELF_KEEPORIENTATION))
	{
		thing->Angles.Yaw = angle;
	}
	else
	{
		angle = thing->Angles.Yaw;
	}
	// Spawn teleport fog at source and destination
	if ((flags & TELF_SOURCEFOG) && !predicting)
	{
		P_SpawnTeleportFog(thing, old, true, true); //Passes the actor through which then pulls the TeleFog metadata types based on properties.
	}
	if (flags & TELF_DESTFOG)
	{
		if (!predicting)
		{
			DVector2 vector = angle.ToVector(20);
			DVector2 fogpos = P_GetOffsetPosition(pos.X, pos.Y, vector.X, vector.Y);
			P_SpawnTeleportFog(thing, DVector3(fogpos, thing->Z()), false, true);

		}
		if (thing->player)
		{
			// [RH] Zoom player's field of vision
			// [BC] && bHaltVelocity.
			if (telezoom && thing->player->mo == thing && !(flags & TELF_KEEPVELOCITY))
				thing->player->FOV = MIN (175.f, thing->player->DesiredFOV + 45.f);
		}
	}
	// [BC] && bHaltVelocity.
	if (thing->player && ((flags & TELF_DESTFOG) || !(flags & TELF_KEEPORIENTATION)) && !(flags & TELF_KEEPVELOCITY))
	{
		// Freeze player for about .5 sec
		if (thing->Inventory == NULL || !thing->Inventory->GetNoTeleportFreeze())
			thing->reactiontime = 18;
	}
	if (thing->flags & MF_MISSILE)
	{
		thing->VelFromAngle(missilespeed);
	}
	// [BC] && bHaltVelocity.
	else if (!(flags & TELF_KEEPORIENTATION) && !(flags & TELF_KEEPVELOCITY))
	{ // no fog doesn't alter the player's momentum
		thing->Vel.Zero();
		// killough 10/98: kill all bobbing velocity too
		if (player)	player->Vel.Zero();
	}
	return true;
}